

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall
CFFFileInput::ReadCFFFile
          (CFFFileInput *this,IByteReaderWithPosition *inCFFFile,unsigned_short inFontIndex)

{
  EStatusCode EVar1;
  allocator<char> local_41;
  string local_40;
  unsigned_short local_1a;
  IByteReaderWithPosition *pIStack_18;
  unsigned_short inFontIndex_local;
  IByteReaderWithPosition *inCFFFile_local;
  CFFFileInput *this_local;
  
  local_1a = inFontIndex;
  pIStack_18 = inCFFFile;
  inCFFFile_local = (IByteReaderWithPosition *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  EVar1 = ReadCFFFileByIndexOrName(this,inCFFFile,&local_40,local_1a);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return EVar1;
}

Assistant:

EStatusCode CFFFileInput::ReadCFFFile(IByteReaderWithPosition* inCFFFile,unsigned short inFontIndex)
{
	return ReadCFFFileByIndexOrName(inCFFFile,"",inFontIndex);
}